

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O3

unique_ptr<lunasvg::Document,_std::default_delete<lunasvg::Document>_> __thiscall
lunasvg::Document::loadFromFile(Document *this,string *filename)

{
  char cVar1;
  string content;
  ifstream fs;
  char *local_240;
  size_t local_238;
  char local_230;
  undefined7 uStack_22f;
  string local_220 [520];
  
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,(_Ios_Openmode)filename);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    (this->m_rootElement)._M_t.
    super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>.
    _M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
    .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl = (SVGRootElement *)0x0;
  }
  else {
    local_238 = 0;
    local_230 = '\0';
    local_240 = &local_230;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_220,(string *)&local_240,'\0');
    std::ifstream::close();
    loadFromData(this,local_240,local_238);
    if (local_240 != &local_230) {
      operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
    }
  }
  std::ifstream::~ifstream(local_220);
  return (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         (__uniq_ptr_data<lunasvg::Document,_std::default_delete<lunasvg::Document>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Document> Document::loadFromFile(const std::string& filename)
{
    std::ifstream fs;
    fs.open(filename);
    if(!fs.is_open())
        return nullptr;
    std::string content;
    std::getline(fs, content, '\0');
    fs.close();
    return loadFromData(content);
}